

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NN.cpp
# Opt level: O0

void __thiscall NN::addOpMinus_Mat(NN *this,int res,int a,int b)

{
  NN *this_00;
  int in_ESI;
  NeuronMat *in_RDI;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  NN *in_stack_ffffffffffffffb0;
  NN *this_01;
  
  addedge(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  addedge(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  this_00 = (NN *)operator_new(0x38);
  this_01 = this_00;
  getNeuron(this_00,in_ESI);
  getNeuron(this_00,in_ESI);
  getNeuron(this_00,in_ESI);
  MathOp::Minus_Mat::Minus_Mat
            ((Minus_Mat *)this_01,in_RDI,(NeuronMat *)this_00,
             (NeuronMat *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8));
  setOp(this_00,in_ESI,(Op *)0x117f9a);
  return;
}

Assistant:

void NN::addOpMinus_Mat(int res, int a, int b) {
    addedge(a, res);
    addedge(b, res);
    setOp(res, new MathOp::Minus_Mat(getNeuron(res), getNeuron(a), getNeuron(b)));
}